

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

bool __thiscall libtorrent::aux::torrent::set_metadata(torrent *this,span<const_char> metadata_buf)

{
  shared_ptr<libtorrent::torrent_info> *this_00;
  info_hash_t *this_01;
  element_type *peVar1;
  session_interface *psVar2;
  pointer pppVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  int iVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  protocol_version extraout_DL;
  protocol_version extraout_DL_00;
  EVP_PKEY_CTX *ctx;
  uint *this_02;
  pointer pppVar11;
  span<const_char> buffer;
  int in_stack_fffffffffffffef0;
  bool failed;
  undefined1 local_108 [37];
  undefined1 auStack_e3 [11];
  shared_ptr<libtorrent::torrent_info> info;
  info_hash_t old_ih;
  int pos;
  bdecode_node metadata;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_40;
  
  buffer.m_ptr = (char *)metadata_buf.m_len;
  peVar1 = (this->super_torrent_hot_members).m_torrent_file.
           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (0 < (peVar1->m_files).m_piece_length) {
    return false;
  }
  this_00 = &(this->super_torrent_hot_members).m_torrent_file;
  bVar9 = info_hash_t::has_v1(&peVar1->m_info_hash);
  if (bVar9) {
    lcrypto::hasher::hasher((hasher *)&metadata,metadata_buf);
    lcrypto::hasher::final(&old_ih.v1,(hasher *)&metadata);
    lcrypto::hasher::~hasher((hasher *)&metadata);
    bVar9 = digest32<160L>::operator!=
                      (&old_ih.v1,
                       &(((this_00->
                          super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr)->m_info_hash).v1);
    if (bVar9) {
      lcrypto::hasher256::hasher256((hasher256 *)local_108,metadata_buf);
      lcrypto::hasher256::final((sha256_hash *)&metadata,(hasher256 *)local_108);
      lcrypto::hasher256::~hasher256((hasher256 *)local_108);
      local_108._16_4_ =
           metadata.m_tokens.
           super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_;
      local_108._0_8_ =
           metadata.m_tokens.
           super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_108._8_8_ =
           metadata.m_tokens.
           super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      bVar9 = digest32<160L>::operator!=
                        ((digest32<160L> *)local_108,
                         &(((this_00->
                            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr)->m_info_hash).v1);
      if (bVar9) {
        iVar10 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[5])();
        if ((*(uint *)(CONCAT44(extraout_var,iVar10) + 0x68) & 1) == 0) {
          return false;
        }
        iVar10 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[5])();
        get_handle((torrent *)local_108);
        local_48._M_pi._0_4_ = 0x1e;
        alert_manager::
        emplace_alert<libtorrent::metadata_failed_alert,libtorrent::torrent_handle,libtorrent::errors::error_code_enum>
                  ((alert_manager *)CONCAT44(extraout_var_00,iVar10),(torrent_handle *)local_108,
                   (error_code_enum *)&local_48);
        this_02 = (uint *)(local_108 + 8);
        goto LAB_002e2b5f;
      }
    }
  }
  bVar9 = info_hash_t::has_v2(&((this_00->
                                super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr)->m_info_hash);
  if (bVar9) {
    lcrypto::hasher256::hasher256((hasher256 *)&old_ih,metadata_buf);
    lcrypto::hasher256::final((sha256_hash *)&metadata,(hasher256 *)&old_ih);
    lcrypto::hasher256::~hasher256((hasher256 *)&old_ih);
    bVar9 = digest32<256L>::operator!=
                      ((digest32<256L> *)&metadata,
                       &(((this_00->
                          super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr)->m_info_hash).v2);
    if (bVar9) {
      iVar10 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                 _vptr_session_logger[5])();
      if ((*(uint *)(CONCAT44(extraout_var_01,iVar10) + 0x68) & 1) == 0) {
        return false;
      }
      iVar10 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                 _vptr_session_logger[5])();
      get_handle((torrent *)&old_ih);
      local_108._0_4_ = 0x1e;
      alert_manager::
      emplace_alert<libtorrent::metadata_failed_alert,libtorrent::torrent_handle,libtorrent::errors::error_code_enum>
                ((alert_manager *)CONCAT44(extraout_var_02,iVar10),(torrent_handle *)&old_ih,
                 (error_code_enum *)local_108);
      this_02 = old_ih.v1.m_number._M_elems + 2;
LAB_002e2b5f:
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)this_02);
      return false;
    }
  }
  peVar1 = (this->super_torrent_hot_members).m_torrent_file.
           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  old_ih.v2.m_number._M_elems[7] = (peVar1->m_info_hash).v2.m_number._M_elems[7];
  old_ih.v1.m_number._M_elems[0] = (peVar1->m_info_hash).v1.m_number._M_elems[0];
  old_ih.v1.m_number._M_elems[1] = (peVar1->m_info_hash).v1.m_number._M_elems[1];
  old_ih.v1.m_number._M_elems[2] = (peVar1->m_info_hash).v1.m_number._M_elems[2];
  old_ih.v1.m_number._M_elems[3] = (peVar1->m_info_hash).v1.m_number._M_elems[3];
  old_ih.v1.m_number._M_elems[4] = (peVar1->m_info_hash).v1.m_number._M_elems[4];
  old_ih.v2.m_number._M_elems[0] = (peVar1->m_info_hash).v2.m_number._M_elems[0];
  old_ih.v2.m_number._M_elems[1] = (peVar1->m_info_hash).v2.m_number._M_elems[1];
  old_ih.v2.m_number._M_elems[2] = (peVar1->m_info_hash).v2.m_number._M_elems[2];
  old_ih.v2.m_number._M_elems[3] = (peVar1->m_info_hash).v2.m_number._M_elems[3];
  old_ih.v2.m_number._M_elems[4] = (peVar1->m_info_hash).v2.m_number._M_elems[4];
  old_ih.v2.m_number._M_elems[5] = (peVar1->m_info_hash).v2.m_number._M_elems[5];
  old_ih.v2.m_number._M_elems[6] = (peVar1->m_info_hash).v2.m_number._M_elems[6];
  stack0xffffffffffffff18 =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(auStack_e3._0_8_ << 0x28);
  pos = 0;
  auStack_e3._3_8_ = &boost::system::detail::cat_holder<void>::system_category_instance;
  iVar10 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
             [0x2e])();
  iVar10 = session_settings::get_int((session_settings *)CONCAT44(extraout_var_03,iVar10),0x4096);
  buffer.m_len = (difference_type)(local_108 + 0x20);
  bdecode(&metadata,(libtorrent *)metadata_buf.m_ptr,buffer,(error_code *)&pos,(int *)0xc8,iVar10,
          in_stack_fffffffffffffef0);
  ::std::make_shared<libtorrent::torrent_info,libtorrent::torrent_info&>((torrent_info *)&info);
  peVar1 = info.super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (local_108[0x24] == false) {
    iVar10 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
               _vptr_session_logger[0x2e])();
    iVar10 = session_settings::get_int((session_settings *)CONCAT44(extraout_var_04,iVar10),0x4095);
    bVar9 = torrent_info::parse_info_section
                      (peVar1,&metadata,(error_code *)(local_108 + 0x20),iVar10);
    if (bVar9) {
      local_108._0_8_ = &failed;
      failed = false;
      this_01 = &(info.super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->m_info_hash;
      local_108._8_8_ = this;
      local_108._16_8_ = (torrent_info *)&info;
      bVar9 = info_hash_t::has_v1(this_01);
      if (bVar9) {
        set_metadata::anon_class_24_3_1e81adb4::operator()
                  ((anon_class_24_3_1e81adb4 *)local_108,&this_01->v1,extraout_DL);
      }
      bVar9 = info_hash_t::has_v2(this_01);
      if (bVar9) {
        aStack_40._8_4_ =
             ((info.super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->m_info_hash).v2.m_number._M_elems[4];
        local_48._M_pi =
             *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              ((info.super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->m_info_hash).v2.m_number._M_elems;
        aStack_40._M_allocated_capacity =
             *(undefined8 *)
              (((info.super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->m_info_hash).v2.m_number._M_elems + 2);
        set_metadata::anon_class_24_3_1e81adb4::operator()
                  ((anon_class_24_3_1e81adb4 *)local_108,(sha1_hash *)&local_48,extraout_DL_00);
      }
      bVar9 = true;
      if ((failed == false) && (((this->super_torrent_hot_members).field_0x4b & 4) == 0)) {
        ::std::__shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&this_00->
                    super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>,
                   &info.super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>);
        peVar1 = (this->super_torrent_hot_members).m_torrent_file.
                 super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        psVar2 = (this->super_torrent_hot_members).m_ses;
        uVar4 = *(undefined8 *)((peVar1->m_info_hash).v1.m_number._M_elems + 2);
        uVar5 = *(undefined8 *)((peVar1->m_info_hash).v1.m_number._M_elems + 4);
        uVar6 = *(undefined8 *)((peVar1->m_info_hash).v2.m_number._M_elems + 1);
        uVar7 = *(undefined8 *)((peVar1->m_info_hash).v2.m_number._M_elems + 3);
        uVar8 = *(undefined8 *)((peVar1->m_info_hash).v2.m_number._M_elems + 5);
        *(undefined8 *)(this->m_info_hash).v1.m_number._M_elems =
             *(undefined8 *)(peVar1->m_info_hash).v1.m_number._M_elems;
        *(undefined8 *)((this->m_info_hash).v1.m_number._M_elems + 2) = uVar4;
        *(undefined8 *)((this->m_info_hash).v1.m_number._M_elems + 4) = uVar5;
        *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 1) = uVar6;
        *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 3) = uVar7;
        *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 5) = uVar8;
        (this->m_info_hash).v2.m_number._M_elems[7] = (peVar1->m_info_hash).v2.m_number._M_elems[7];
        (this->super_torrent_hot_members).m_size_on_disk = (peVar1->m_files).m_size_on_disk;
        ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<libtorrent::aux::torrent,void>
                  ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)local_108,
                   (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
                   &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
        ctx = (EVP_PKEY_CTX *)local_108;
        (*(psVar2->super_session_logger)._vptr_session_logger[0x1a])(psVar2,ctx,&old_ih);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8));
        join_0x00000010_0x00000000_ = initialize_merkle_trees(this);
        if ((local_108._32_8_ >> 0x20 & 1) == 0) {
          update_gauge(this);
          update_want_tick(this);
          iVar10 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                     _vptr_session_logger[5])();
          if ((*(uint *)(CONCAT44(extraout_var_05,iVar10) + 0x68) & 0x40) != 0) {
            iVar10 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                       _vptr_session_logger[5])();
            get_handle((torrent *)local_108);
            ctx = (EVP_PKEY_CTX *)local_108;
            alert_manager::
            emplace_alert<libtorrent::metadata_received_alert,libtorrent::torrent_handle>
                      ((alert_manager *)CONCAT44(extraout_var_06,iVar10),(torrent_handle *)ctx);
            ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                      ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8));
          }
          init(this,ctx);
          inc_stats_counter(this,0x6e,
                            (((this->super_torrent_hot_members).m_torrent_file.
                              super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->m_files).m_num_pieces);
          pppVar3 = (this->super_torrent_hot_members).m_connections.
                    super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                    .
                    super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (pppVar11 = (this->super_torrent_hot_members).m_connections.
                          super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                          .
                          super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                          ._M_impl.super__Vector_impl_data._M_start; pppVar11 != pppVar3;
              pppVar11 = pppVar11 + 1) {
            peer_connection::disconnect_if_redundant(*pppVar11);
          }
          set_need_save_resume(this,(resume_data_flags_t)0x80);
        }
        else {
          set_error(this,(error_code *)(local_108 + 0x20),(file_index_t)0xfffffffc);
          bVar9 = false;
          pause(this);
        }
      }
      goto LAB_002e2e8b;
    }
  }
  update_gauge(this);
  iVar10 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
             [5])();
  if ((*(uint *)(CONCAT44(extraout_var_07,iVar10) + 0x68) & 1) != 0) {
    iVar10 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
               _vptr_session_logger[5])();
    get_handle((torrent *)local_108);
    alert_manager::
    emplace_alert<libtorrent::metadata_failed_alert,libtorrent::torrent_handle,boost::system::error_code&>
              ((alert_manager *)CONCAT44(extraout_var_08,iVar10),(torrent_handle *)local_108,
               (error_code *)(local_108 + 0x20));
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8));
  }
  boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
            ((error_code *)local_108,invalid_swarm_metadata,(type *)0x0);
  set_error(this,(error_code *)local_108,(file_index_t)0xffffffff);
  bVar9 = false;
  pause(this);
LAB_002e2e8b:
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&info.super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::
  _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
  ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 *)&metadata);
  return bVar9;
}

Assistant:

bool torrent::set_metadata(span<char const> metadata_buf)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		if (m_torrent_file->is_valid()) return false;

		if (m_torrent_file->info_hashes().has_v1())
		{
			sha1_hash const info_hash = hasher(metadata_buf).final();
			if (info_hash != m_torrent_file->info_hashes().v1)
			{
				// check if the v1 hash is a truncated v2 hash
				sha256_hash const info_hash2 = hasher256(metadata_buf).final();
				if (sha1_hash(info_hash2.data()) != m_torrent_file->info_hashes().v1)
				{
					if (alerts().should_post<metadata_failed_alert>())
					{
						alerts().emplace_alert<metadata_failed_alert>(get_handle()
							, errors::mismatching_info_hash);
					}
					return false;
				}
			}
		}
		if (m_torrent_file->info_hashes().has_v2())
		{
			// we don't have to worry about computing the v2 hash twice because
			// if the v1 hash was a truncated v2 hash then the torrent_file should
			// not have a v2 hash and we shouldn't get here
			sha256_hash const info_hash = hasher256(metadata_buf).final();
			if (info_hash != m_torrent_file->info_hashes().v2)
			{
				if (alerts().should_post<metadata_failed_alert>())
				{
					alerts().emplace_alert<metadata_failed_alert>(get_handle()
						, errors::mismatching_info_hash);
				}
				return false;
			}
		}

		// the torrent's info hash might change
		// e.g. it could be a hybrid torrent which we only had one of the hashes for
		// so remove the existing entry
		info_hash_t const old_ih = m_torrent_file->info_hashes();

		error_code ec;
		int pos = 0;
		bdecode_node const metadata = bdecode(metadata_buf, ec, &pos, 200
			, settings().get_int(settings_pack::metadata_token_limit));

		auto info = std::make_shared<torrent_info>(*m_torrent_file);
		if (ec || !info->parse_info_section(metadata, ec
			, settings().get_int(settings_pack::max_piece_count)))
		{
			update_gauge();
			// this means the metadata is correct, since we
			// verified it against the info-hash, but we
			// failed to parse it. Pause the torrent
			if (alerts().should_post<metadata_failed_alert>())
			{
				alerts().emplace_alert<metadata_failed_alert>(get_handle(), ec);
			}
			set_error(errors::invalid_swarm_metadata, torrent_status::error_file_none);
			pause();
			return false;
		}

		// we might already have this torrent in the session.
		bool failed = false;
		info->info_hashes().for_each([&](sha1_hash const& ih, protocol_version)
		{
			if (failed) return;

			auto t = m_ses.find_torrent(info_hash_t(ih)).lock();
			if (t && t != shared_from_this())
			{
				TORRENT_ASSERT(!t->valid_metadata());

				// if we get a collision, both torrents fail and have to be
				// removed. This is because updating the info_hash_t for this
				// torrent would conflict with torrent "t". That would violate
				// the invariants:
				//   1. an info-hash can only refer to a single torrent
				//   2. every torrent needs at least one info-hash.
				t->set_error(errors::duplicate_torrent, torrent_status::error_file_metadata);
				t->pause();

				set_error(errors::duplicate_torrent, torrent_status::error_file_metadata);
				pause();
				failed = true;

				if (alerts().should_post<torrent_conflict_alert>())
				{
					alerts().emplace_alert<torrent_conflict_alert>(get_handle()
						, torrent_handle(std::move(t)), std::move(info));
				}
			}
		});

		if (failed) return true;
		if (m_abort) return true;

		m_torrent_file = info;
		m_info_hash = m_torrent_file->info_hashes();

		m_size_on_disk = m_torrent_file->files().size_on_disk();

		m_ses.update_torrent_info_hash(shared_from_this(), old_ih);

		ec = initialize_merkle_trees();
		if (ec)
		{
			set_error(ec, torrent_status::error_file_metadata);
			pause();
			return false;
		}

		update_gauge();
		update_want_tick();

		if (m_ses.alerts().should_post<metadata_received_alert>())
		{
			m_ses.alerts().emplace_alert<metadata_received_alert>(
				get_handle());
		}

		// we have to initialize the torrent before we start
		// disconnecting redundant peers, otherwise we'll think
		// we're a seed, because we have all 0 pieces
		init();

		inc_stats_counter(counters::num_total_pieces_added
			, m_torrent_file->num_pieces());

		// disconnect redundant peers
		for (auto* p : m_connections)
			p->disconnect_if_redundant();

		set_need_save_resume(torrent_handle::if_metadata_changed);

		return true;
	}